

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
Matrix::RandomNumbersInMatrix
          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,Matrix *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *matrixVec)

{
  vector<int,std::allocator<int>> *this_00;
  iterator __position;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar1;
  int iVar2;
  time_t tVar3;
  int iVar4;
  long lVar5;
  int randomNumber;
  int local_5c;
  vector<int,_std::allocator<int>_> local_58;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  
  lVar5 = 0;
  local_38 = __return_storage_ptr__;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  do {
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)matrixVec,&local_58);
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar4 = 5;
    do {
      iVar2 = rand();
      local_5c = iVar2 % 5 + 1;
      this_00 = (vector<int,std::allocator<int>> *)
                ((matrixVec->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar5);
      __position._M_current = *(int **)(this_00 + 8);
      if (__position._M_current == *(int **)(this_00 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this_00,__position,&local_5c);
      }
      else {
        *__position._M_current = local_5c;
        *(int **)(this_00 + 8) = __position._M_current + 1;
      }
      pvVar1 = local_38;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(local_38,matrixVec);
  return pvVar1;
}

Assistant:

std::vector<std::vector<int>> Matrix::RandomNumbersInMatrix(std::vector<std::vector<int>>& matrixVec) {
	srand(time(0));
	int randomNumber;
	int const numberOfFigures = 5;
	for (int i = 0; i < _rows; ++i) {
		matrixVec.push_back(std::vector<int>());

		for (int j = 0; j < _columns; ++j) {
			randomNumber = rand() % numberOfFigures + 1;
			matrixVec[i].push_back(randomNumber);
		}
	}

	return matrixVec;
}